

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptors(Generator *this)

{
  Printer *this_00;
  int iVar1;
  int iVar2;
  Descriptor *pDVar3;
  EnumDescriptor *descriptor;
  FieldDescriptor *descriptor_00;
  allocator local_41;
  string local_40;
  int local_20;
  int local_1c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Generator *this_local;
  
  i_2 = 0;
  _i_1 = this;
  while( true ) {
    iVar1 = i_2;
    iVar2 = FileDescriptor::message_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    pDVar3 = FileDescriptor::message_type(this->file_,i_2);
    FixForeignFieldsInDescriptor(this,pDVar3,(Descriptor *)0x0);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = i_3;
    iVar2 = FileDescriptor::message_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    pDVar3 = FileDescriptor::message_type(this->file_,i_3);
    AddMessageToFileDescriptor(this,pDVar3);
    i_3 = i_3 + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = FileDescriptor::enum_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    descriptor = FileDescriptor::enum_type(this->file_,local_1c);
    AddEnumToFileDescriptor(this,descriptor);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    iVar2 = FileDescriptor::extension_count(this->file_);
    if (iVar2 <= iVar1) break;
    descriptor_00 = FileDescriptor::extension(this->file_,local_20);
    AddExtensionToFileDescriptor(this,descriptor_00);
    local_20 = local_20 + 1;
  }
  this_00 = this->printer_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"DESCRIPTOR",&local_41);
  io::Printer::Print(this_00,"_sym_db.RegisterFileDescriptor($name$)\n","name",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*file_->message_type(i), NULL);
  }
  for (int i = 0; i < file_->message_type_count(); ++i) {
    AddMessageToFileDescriptor(*file_->message_type(i));
  }
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    AddEnumToFileDescriptor(*file_->enum_type(i));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    AddExtensionToFileDescriptor(*file_->extension(i));
  }
  // TODO(jieluo): Move this register to PrintFileDescriptor() when
  // FieldDescriptor.file is added in generated file.
  printer_->Print("_sym_db.RegisterFileDescriptor($name$)\n", "name",
                  kDescriptorKey);
  printer_->Print("\n");
}